

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O2

uint my_rational_to_uint(my_rational *a,uint scale,uint *remainder)

{
  ulong uVar1;
  ulong uVar2;
  _Bool _Var3;
  wchar_t wVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint16_t qr_u16n [2];
  uint16_t d_u16n [2];
  uint16_t r2_u16n [2];
  uint16_t r_u16n [2];
  uint16_t rr_u16n [4];
  uint16_t p_u16n [4];
  uint16_t w_u16n [3];
  
  if (scale == 0) {
    uVar5 = 0;
  }
  else {
    uVar5 = a->d;
    uVar1 = (ulong)a->n / (ulong)uVar5;
    uVar2 = (ulong)a->n % (ulong)uVar5;
    if ((int)(scale * uVar1 >> 0x20) == 0) {
      uVar10 = (int)uVar1 * scale;
      uVar6 = (uint)uVar2;
      uVar8 = (scale / uVar5) * uVar6;
      uVar9 = uVar8 + uVar10;
      if (!CARRY4(uVar8,uVar10)) {
        uVar8 = (uint)((ulong)scale % (ulong)uVar5);
        if ((uVar6 == 0) || ((int)(uVar2 * ((ulong)scale % (ulong)uVar5) >> 0x20) == 0)) {
          uVar8 = uVar8 * uVar6;
          uVar6 = uVar8 / uVar5;
          uVar10 = uVar6 + uVar9;
          if (!CARRY4(uVar6,uVar9)) {
            if (remainder == (uint *)0x0) {
              return uVar10;
            }
            *remainder = uVar8 % uVar5;
            return uVar10;
          }
        }
        else {
          _Var3 = ini_u16n(r_u16n,2,uVar6);
          if (_Var3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6e5,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          _Var3 = ini_u16n(r2_u16n,2,uVar8);
          if (_Var3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6e9,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          _Var3 = ini_u16n(d_u16n,2,uVar5);
          if (_Var3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6ed,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          _Var3 = mul_u16n(p_u16n,r_u16n,r2_u16n,4,2,2);
          if (_Var3) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6f2,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          wVar4 = div_u16n(qr_u16n,rr_u16n,w_u16n,p_u16n,d_u16n,2,4,2);
          if (wVar4 != L'\0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6f7,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          sVar7 = msb_u16n(qr_u16n,2);
          if (0x20 < sVar7) {
            __assert_fail("msb_u16n(qr_u16n, MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x6fa,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
          uVar5 = ext_u16n(qr_u16n,2);
          if (!CARRY4(uVar5,uVar9)) {
            if (remainder == (uint *)0x0) {
              return uVar5 + uVar9;
            }
            sVar7 = msb_u16n(rr_u16n,4);
            if (sVar7 < 0x21) {
              uVar6 = ext_u16n(rr_u16n,4);
              *remainder = uVar6;
              if (uVar6 < a->d) {
                return uVar5 + uVar9;
              }
              __assert_fail("*remainder < a->d",
                            "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                            ,0x702,
                            "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                           );
            }
            __assert_fail("msb_u16n(rr_u16n, 2 * MP_DIGITS) <= sizeof(unsigned int) * CHAR_BIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/z-util.c"
                          ,0x700,
                          "unsigned int my_rational_to_uint(const struct my_rational *, unsigned int, unsigned int *)"
                         );
          }
        }
      }
    }
    uVar5 = 0xffffffff;
  }
  if (remainder != (uint *)0x0) {
    *remainder = 0;
  }
  return uVar5;
}

Assistant:

unsigned int my_rational_to_uint(const struct my_rational *a,
		unsigned int scale, unsigned int *remainder)
{
	unsigned int result, r, q, r2, t;

	if (!scale) {
		if (remainder) {
			*remainder = 0;
		}
		return 0;
	}
	result = a->n / a->d;
	if (result > UINT_MAX / scale) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result *= scale;
	r = a->n % a->d;
	q = scale / a->d;
	if (result > UINT_MAX - q * r) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result += q * r;
	r2 = scale - q * a->d;
	if (r && r2 > UINT_MAX / r) {
		/*
		 * The product of the remainders overflows in the native
		 * arithmetic so use multiprecision integers.
		 */
#define MP_DIGITS ((sizeof(unsigned int) + (sizeof(uint16_t) - 1)) / sizeof(uint16_t))
		uint16_t r_u16n[MP_DIGITS], r2_u16n[MP_DIGITS];
		uint16_t d_u16n[MP_DIGITS], p_u16n[2 * MP_DIGITS];
		uint16_t qr_u16n[MP_DIGITS], rr_u16n[2 * MP_DIGITS];
		uint16_t w_u16n[MP_DIGITS + 1];
		bool over;

		over = ini_u16n(r_u16n, MP_DIGITS, r);
		if (over) {
			assert(0);
		}
		over = ini_u16n(r2_u16n, MP_DIGITS, r2);
		if (over) {
			assert(0);
		}
		over = ini_u16n(d_u16n, MP_DIGITS, a->d);
		if (over) {
			assert(0);
		}
		over = mul_u16n(p_u16n, r_u16n, r2_u16n, 2 * MP_DIGITS,
			MP_DIGITS, MP_DIGITS);
		if (over) {
			assert(0);
		}
		over = (div_u16n(qr_u16n, rr_u16n, w_u16n, p_u16n, d_u16n,
			MP_DIGITS, 2 * MP_DIGITS, MP_DIGITS) != 0);
		if (over) {
			assert(0);
		}
		assert(msb_u16n(qr_u16n, MP_DIGITS)
			<= sizeof(unsigned int) * CHAR_BIT);
		q = ext_u16n(qr_u16n, MP_DIGITS);
		if (result <= UINT_MAX - q) {
			result += q;
			if (remainder) {
				assert(msb_u16n(rr_u16n, 2 * MP_DIGITS)
					<= sizeof(unsigned int) * CHAR_BIT);
				*remainder = ext_u16n(rr_u16n, 2 * MP_DIGITS);
				assert(*remainder < a->d);
			}
		} else {
			result = UINT_MAX;
			if (remainder) {
				*remainder = 0;
			}
		}
		return result;
#undef MP_DIGITS
	}
	t = r * r2;
	q = t / a->d;
	if (result > UINT_MAX - q) {
		if (remainder) {
			*remainder = 0;
		}
		return UINT_MAX;
	}
	result += q;
	if (remainder) {
		*remainder = t - q * a->d;
	}
	return result;
}